

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O0

ret_t_conflict1 *
trng::utility::u01xx_traits<long_double,_1UL,_generator_max<trng::mt19937>_>::variate_max(void)

{
  ret_t_conflict1 *in_RAX;
  size_t i;
  ret_t_conflict1 ret;
  ret_t_conflict1 max_addin;
  ret_t_conflict1 scale_per_step;
  
  return in_RAX;
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t variate_max() {
        const ret_t scale_per_step{static_cast<ret_t>(domain_max) + 1};
        const ret_t max_addin{static_cast<ret_t>(domain_max)};
        ret_t ret{max_addin};
        for (std::size_t i{1}; i < calls_needed; ++i)
          ret = ret * scale_per_step + max_addin;
        return ret;
      }